

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::GetKeyPressedAmount(int key_index,float repeat_delay,float repeat_rate)

{
  float t1;
  uint in_EDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float t;
  ImGuiContext *g;
  bool local_1d;
  int local_4;
  
  if ((int)in_EDI < 0) {
    local_4 = 0;
  }
  else {
    local_1d = 0x1ff < in_EDI;
    if (local_1d) {
      __assert_fail("key_index >= 0 && key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x115f,"int ImGui::GetKeyPressedAmount(int, float, float)");
    }
    t1 = (GImGui->IO).KeysDownDuration[(int)in_EDI];
    local_4 = CalcTypematicRepeatAmount(t1 - (GImGui->IO).DeltaTime,t1,in_XMM0_Da,in_XMM1_Da);
  }
  return local_4;
}

Assistant:

int ImGui::GetKeyPressedAmount(int key_index, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    if (key_index < 0)
        return 0;
    IM_ASSERT(key_index >= 0 && key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[key_index];
    return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, repeat_delay, repeat_rate);
}